

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::
RangeEquals<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,_List_iterator<long> expected_first,
          _List_iterator<long> expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last)

{
  ptrdiff_t expected_len;
  long got_len;
  pair<std::_List_iterator<long>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  pVar1;
  allocator local_61;
  Assert *local_60;
  string *local_58;
  string local_50;
  
  local_60 = this;
  local_58 = msg;
  expected_len = std::__distance<long>(expected_first._M_node,expected_last._M_node);
  got_len = (long)got_last._M_current - (long)got_first._M_current >> 2;
  if (expected_len != got_len) {
    std::__cxx11::string::string((string *)&local_50," length",&local_61);
    RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_60,local_58,&local_50,expected_first,expected_last,got_first,got_last,
               expected_last,expected_len,got_len);
  }
  pVar1 = std::
          __mismatch<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (expected_first._M_node,expected_last._M_node,got_first._M_current);
  if (pVar1.first._M_node._M_node == expected_last._M_node) {
    return;
  }
  std::__cxx11::string::string((string *)&local_50,"",&local_61);
  RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_60,local_58,&local_50,expected_first,expected_last,got_first,got_last,
             pVar1.first._M_node,expected_len,expected_len);
}

Assistant:

void RangeEquals(const std::string& msg, ExpectedIt expected_first, ExpectedIt expected_last,
            GotIterator got_first, GotIterator got_last) const
        {
            auto expected_len = std::distance(expected_first, expected_last);
            auto got_len      = std::distance(got_first, got_last);
            if (expected_len != got_len)
            {
                RangeError(msg, " length", expected_first, expected_last, got_first, got_last, expected_last,
                    expected_len, got_len);
            }

            auto dif = std::mismatch(expected_first, expected_last, got_first).first;
            if (dif != expected_last)
            {
                RangeError(msg, "", expected_first, expected_last, got_first, got_last, dif, expected_len, got_len);
            }
        }